

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

char * TextSubtext(char *text,int position,int length)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = TextLength(text);
  uVar2 = 0;
  if ((int)uVar1 <= position) {
    length = 0;
    position = uVar1 - 1;
  }
  if ((int)uVar1 <= length) {
    length = uVar1;
  }
  uVar3 = 0;
  if (0 < length) {
    uVar3 = (ulong)(uint)length;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    TextSubtext::buffer[uVar2] = text[uVar2 + (long)position];
  }
  TextSubtext::buffer[length] = '\0';
  return TextSubtext::buffer;
}

Assistant:

const char *TextSubtext(const char *text, int position, int length)
{
    static char buffer[MAX_TEXT_BUFFER_LENGTH] = { 0 };

    int textLength = TextLength(text);

    if (position >= textLength)
    {
        position = textLength - 1;
        length = 0;
    }

    if (length >= textLength) length = textLength;

    for (int c = 0 ; c < length ; c++)
    {
        *(buffer + c) = *(text + position);
        text++;
    }

    *(buffer + length) = '\0';

    return buffer;
}